

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

void cdns_pkt_from_client(int fd,short what,void *_arg)

{
  int iVar1;
  int iVar2;
  void *data;
  void *pvVar3;
  server_info *psVar4;
  long *__ptr;
  long lVar5;
  size_t len;
  int line;
  sockaddr_storage *psVar6;
  long *plVar7;
  int priority;
  char *pcVar8;
  char *fmt;
  int i_1;
  int i;
  long lVar9;
  byte bVar10;
  server_info *svrs [2];
  socklen_t addr_len;
  timeval timeout;
  char ip_str [55];
  sockaddr_storage client_addr;
  char buf [4096];
  
  bVar10 = 0;
  timeout.tv_sec = (__time_t)g_cdns_cfg.timeout;
  timeout.tv_usec = 0;
  addr_len = 0x80;
  data = (void *)recvfrom(fd,buf,0x1000,0,(sockaddr *)&client_addr,&addr_len);
  if (data == (void *)0xffffffffffffffff) {
    return;
  }
  if ((data < (void *)0xd) || (iVar1 = dns_validate_request(buf,(size_t)data), iVar1 != 0)) {
    pcVar8 = "incomplete or malformed DNS request";
    iVar1 = 6;
    iVar2 = 0x240;
  }
  else {
    pvVar3 = (void *)dns_append_edns_opt(buf,(size_t)data,0x1000);
    if (pvVar3 < (void *)0x1001) {
      data = pvVar3;
    }
    svrs[0] = (server_info *)0x0;
    svrs[1] = (server_info *)0x0;
    psVar4 = choose_server((server_info **)0x0,0);
    svrs[0] = psVar4;
    if (psVar4 != (server_info *)0x0) {
      lVar9 = 1;
      while ((lVar9 != 2 && (psVar4 != (server_info *)0x0))) {
        psVar4 = choose_server(svrs,(int)lVar9);
        svrs[lVar9] = psVar4;
        lVar9 = lVar9 + 1;
      }
      iVar1 = -1;
      lVar9 = 0;
      do {
        if (lVar9 == 2) {
          return;
        }
        psVar4 = svrs[lVar9];
        if (psVar4 == (server_info *)0x0) {
          return;
        }
        __ptr = (long *)calloc(0xb8,1);
        if (__ptr == (long *)0x0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x25b,"cdns_pkt_from_client",0,3,"Out of memeory.");
LAB_001065aa:
          if (-1 < iVar1) {
            evutil_closesocket(iVar1);
          }
        }
        else {
          *(undefined2 *)(__ptr + 1) = 0;
          *(uint16_t *)((long)__ptr + 0xe) = g_cdns_cfg.timeout;
          gettimeofday((timeval *)(__ptr + 0x13),(__timezone_ptr_t)0x0);
          *(undefined2 *)((long)__ptr + 0xc) = buf._0_2_;
          psVar6 = &client_addr;
          plVar7 = __ptr + 2;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *plVar7 = *(long *)psVar6;
            psVar6 = (sockaddr_storage *)((long)psVar6 + (ulong)bVar10 * -0x10 + 8);
            plVar7 = plVar7 + (ulong)bVar10 * -2 + 1;
          }
          *__ptr = (long)psVar4;
          pcVar8 = ip_str;
          fmt_sockaddr_port((sockaddr *)&psVar4->addr,pcVar8,0x37);
          len = 0;
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x267,"cdns_pkt_from_client",0,7,"Forwarding request to %s",pcVar8);
          iVar1 = forward_dns_request((sockaddr *)&psVar4->addr,(socklen_t)buf,data,len);
          if (iVar1 == -1) {
            line = 0x26c;
            iVar2 = 0;
            priority = 6;
            fmt = "Failed to forward DNS request";
LAB_00106587:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,line,"cdns_pkt_from_client",iVar2,priority,fmt,pcVar8);
LAB_00106591:
            if (__ptr[0x12] != 0) {
              event_free();
            }
            free(__ptr);
            goto LAB_001065aa;
          }
          gettimeofday((timeval *)(__ptr + 0x15),(__timezone_ptr_t)0x0);
          *(int *)(*__ptr + 0x98) = *(int *)(*__ptr + 0x98) + 1;
          lVar5 = event_new(_arg,iVar1,0x12,cdns_readcb,__ptr);
          __ptr[0x12] = lVar5;
          if (lVar5 == 0) {
            line = 0x273;
            iVar2 = 1;
            priority = 3;
            fmt = "event_new";
            goto LAB_00106587;
          }
          iVar2 = event_add(lVar5,&timeout);
          if (iVar2 != 0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0x278,"cdns_pkt_from_client",1,3,"event_add");
            goto LAB_00106591;
          }
          *(undefined2 *)(__ptr + 1) = 1;
        }
        lVar9 = lVar9 + 1;
      } while( true );
    }
    pcVar8 = "No valid DNS resolver available";
    iVar1 = 4;
    iVar2 = 0x24d;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",iVar2,
             "cdns_pkt_from_client",0,iVar1,pcVar8);
  return;
}

Assistant:

static void cdns_pkt_from_client(int fd, short what, void *_arg)
{
    struct event_base * base = _arg;
    dns_request * req = NULL;
    char   buf[DEFAULT_BUFFER_SIZE];
    char   ip_str[INET_ADDR_PORT_STRLEN];
    struct timeval timeout = {g_cdns_cfg.timeout, 0};
    struct sockaddr_storage * dest_addr;
    struct sockaddr_storage client_addr;
    socklen_t addr_len;
    ssize_t pktlen;
    int   relay_fd = -1;
    struct server_info * svr, * svrs[MAX_SERVERS_FOR_ONE_QUERY];

    // Receive DNS request and do basic verification
    addr_len = sizeof(client_addr);
    pktlen = recvfrom(fd, &buf[0], sizeof(buf), 0, (struct sockaddr *)&client_addr, &addr_len);
    if (pktlen == -1)
        return;

    if (pktlen <= sizeof(struct dns_header_t) || dns_validate_request(&buf[0], pktlen)) {
        log_error(LOG_INFO, "incomplete or malformed DNS request");
        return;
    }

    // append ENDS OPT
    size_t new_size = dns_append_edns_opt(&buf[0], pktlen, sizeof(buf));
    if (new_size <= sizeof(buf))
        pktlen = new_size;

    // Choose a server to forward DNS request
    memset(svrs, 0, sizeof(svrs));
    svrs[0] = choose_server(NULL, 0);
    if (!svrs[0]) {
        log_error(LOG_WARNING, "No valid DNS resolver available");
        return;
    }
    // Choose additional servers to forward DNS requests
    for (int i = 1; i < SIZEOF_ARRAY(svrs) && svrs[i-1]; i++)
        svrs[i] = choose_server(&svrs[0], i);
    // Forward DNS requests via each chosen server 
    for (int i = 0; i < SIZEOF_ARRAY(svrs); i++) {
        svr = svrs[i];
        if (!svr)
            break;
        /* allocate and initialize request structure */
        req = (dns_request *)calloc(sizeof(dns_request), 1);
        if (!req) {
            log_error(LOG_ERR, "Out of memeory.");
            goto fail;
        }
        req->state = STATE_NEW;
        req->timeout = g_cdns_cfg.timeout;
        gettimeofday(&req->req_recv_time, 0);
        memcpy(&req->id, &buf[0], sizeof(uint16_t));
        memcpy(&req->client_addr, &client_addr, sizeof(client_addr));
        req->server = svr;
        dest_addr = &req->server->addr;

        fmt_sockaddr_port((struct sockaddr *)dest_addr, &ip_str[0], sizeof(ip_str));
        log_error(LOG_DEBUG, "Forwarding request to %s", &ip_str[0]);
        // 1000 ^_^
        /* Forward DNS request to upstream server */
        relay_fd = forward_dns_request((struct sockaddr *)dest_addr, sizeof(*dest_addr), &buf[0], pktlen);
        if (relay_fd == -1) {
            log_error(LOG_INFO, "Failed to forward DNS request");
            goto fail;
        }
        gettimeofday(&req->req_fwd_time, 0);
        req->server->stats.n_req += 1;
        req->resolver = event_new(base, relay_fd, EV_READ | EV_PERSIST, cdns_readcb, req);
        if (!req->resolver) {
            log_errno(LOG_ERR, "event_new");
            goto fail;
        }
        int error = event_add(req->resolver, &timeout);
        if (error) {
            log_errno(LOG_ERR, "event_add");
            goto fail;
        }

        req->state = STATE_REQUEST_SENT;
        continue;

fail:
        if (req) {
            if (req->resolver)
                event_free(req->resolver);
            free(req);
        }
        if (relay_fd >= 0)
            evutil_closesocket(relay_fd);
    }
}